

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprDeleteNN(sqlite3 *db,Expr *p)

{
  Expr *p_00;
  Select *p_01;
  bool bVar1;
  
  while ((p->flags & 0x810000) == 0) {
    if (p->pRight == (Expr *)0x0) {
      p_01 = (Select *)(p->x).pList;
      if ((p->flags >> 0xc & 1) == 0) {
        if (p_01 != (Select *)0x0) {
          exprListDeleteNN(db,(ExprList *)p_01);
        }
        if ((p->flags & 0x1000000) != 0) {
          sqlite3WindowDelete(db,(p->y).pWin);
        }
      }
      else if (p_01 != (Select *)0x0) {
        clearSelect(db,p_01,1);
      }
    }
    else {
      sqlite3ExprDeleteNN(db,p->pRight);
    }
    p_00 = p->pLeft;
    if ((p_00 == (Expr *)0x0) || (p->op == 0xb2)) break;
    if (((p->flags & 0x8000000) == 0) && ((p_00->flags & 0x8000000) == 0)) {
      sqlite3DbNNFreeNN(db,p);
      bVar1 = false;
      p = p_00;
    }
    else {
      sqlite3ExprDeleteNN(db,p_00);
      bVar1 = true;
    }
    if (bVar1) break;
  }
  if ((p->flags & 0x8000000) != 0) {
    return;
  }
  sqlite3DbNNFreeNN(db,p);
  return;
}

Assistant:

static SQLITE_NOINLINE void sqlite3ExprDeleteNN(sqlite3 *db, Expr *p){
  assert( p!=0 );
  assert( db!=0 );
exprDeleteRestart:
  assert( !ExprUseUValue(p) || p->u.iValue>=0 );
  assert( !ExprUseYWin(p) || !ExprUseYSub(p) );
  assert( !ExprUseYWin(p) || p->y.pWin!=0 || db->mallocFailed );
  assert( p->op!=TK_FUNCTION || !ExprUseYSub(p) );
#ifdef SQLITE_DEBUG
  if( ExprHasProperty(p, EP_Leaf) && !ExprHasProperty(p, EP_TokenOnly) ){
    assert( p->pLeft==0 );
    assert( p->pRight==0 );
    assert( !ExprUseXSelect(p) || p->x.pSelect==0 );
    assert( !ExprUseXList(p) || p->x.pList==0 );
  }
#endif
  if( !ExprHasProperty(p, (EP_TokenOnly|EP_Leaf)) ){
    /* The Expr.x union is never used at the same time as Expr.pRight */
    assert( (ExprUseXList(p) && p->x.pList==0) || p->pRight==0 );
    if( p->pRight ){
      assert( !ExprHasProperty(p, EP_WinFunc) );
      sqlite3ExprDeleteNN(db, p->pRight);
    }else if( ExprUseXSelect(p) ){
      assert( !ExprHasProperty(p, EP_WinFunc) );
      sqlite3SelectDelete(db, p->x.pSelect);
    }else{
      sqlite3ExprListDelete(db, p->x.pList);
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_WinFunc) ){
        sqlite3WindowDelete(db, p->y.pWin);
      }
#endif
    }
    if( p->pLeft && p->op!=TK_SELECT_COLUMN ){
      Expr *pLeft = p->pLeft;
      if( !ExprHasProperty(p, EP_Static)
       && !ExprHasProperty(pLeft, EP_Static)
      ){
        /* Avoid unnecessary recursion on unary operators */
        sqlite3DbNNFreeNN(db, p);
        p = pLeft;
        goto exprDeleteRestart;
      }else{
        sqlite3ExprDeleteNN(db, pLeft);
      }
    }
  }
  if( !ExprHasProperty(p, EP_Static) ){
    sqlite3DbNNFreeNN(db, p);
  }
}